

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O0

void __thiscall
validation_layer::parameterValidationChecker::~parameterValidationChecker
          (parameterValidationChecker *this)

{
  parameterValidationChecker *this_local;
  
  if ((this->enableParameterValidation & 1U) != 0) {
    if (parameterChecker != (long *)0x0) {
      (**(code **)(*parameterChecker + 0xcb8))();
    }
    if (DAT_00322f70 != (long *)0x0) {
      (**(code **)(*DAT_00322f70 + 0x458))();
    }
    if (DAT_00322f68 != (long *)0x0) {
      (**(code **)(*DAT_00322f68 + 0x958))();
    }
  }
  return;
}

Assistant:

parameterValidationChecker::~parameterValidationChecker() {
        if(enableParameterValidation) {
            delete parameterChecker.zeValidation;
            delete parameterChecker.zetValidation;
            delete parameterChecker.zesValidation;
        }
    }